

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Woop<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *this;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 (*pauVar16) [16];
  bool bVar17;
  bool bVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  long lVar24;
  undefined1 (*pauVar25) [16];
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  byte bVar30;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_24b0 [16];
  undefined1 local_2440 [8];
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar31 [32];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  fVar1 = *(float *)&(context->query_radius).field_0;
  auVar35 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24b0 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_24b0 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pauVar23 = (undefined1 (*) [16])local_2390;
  uVar2 = *(undefined4 *)&(query->p).field_0;
  local_23c0._4_4_ = uVar2;
  local_23c0._0_4_ = uVar2;
  local_23c0._8_4_ = uVar2;
  local_23c0._12_4_ = uVar2;
  local_23c0._16_4_ = uVar2;
  local_23c0._20_4_ = uVar2;
  local_23c0._24_4_ = uVar2;
  local_23c0._28_4_ = uVar2;
  auVar47 = ZEXT3264(local_23c0);
  fVar3 = (query->p).field_0.field_0.y;
  auVar45._4_4_ = fVar3;
  auVar45._0_4_ = fVar3;
  auVar45._8_4_ = fVar3;
  auVar45._12_4_ = fVar3;
  auVar45._16_4_ = fVar3;
  auVar45._20_4_ = fVar3;
  auVar45._24_4_ = fVar3;
  auVar45._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar44._4_4_ = fVar4;
  auVar44._0_4_ = fVar4;
  auVar44._8_4_ = fVar4;
  auVar44._12_4_ = fVar4;
  auVar44._16_4_ = fVar4;
  auVar44._20_4_ = fVar4;
  auVar44._24_4_ = fVar4;
  auVar44._28_4_ = fVar4;
  local_23e0 = (context->query_radius).field_0.m128[1];
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  local_2400 = (context->query_radius).field_0.m128[2];
  fStack_23fc = local_2400;
  fStack_23f8 = local_2400;
  fStack_23f4 = local_2400;
  fStack_23f0 = local_2400;
  fStack_23ec = local_2400;
  fStack_23e8 = local_2400;
  fStack_23e4 = local_2400;
  auVar38 = vshufps_avx(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar1)),0);
  auVar31._16_16_ = auVar38;
  auVar31._0_16_ = auVar38;
  bVar18 = false;
LAB_014cd474:
  auVar32 = ZEXT3264(auVar31);
  local_2420 = auVar35._0_32_;
  auVar46 = auVar47._0_32_;
  auVar10 = vsubps_avx(auVar46,local_2420);
  auVar34._0_4_ = auVar47._0_4_ + auVar35._0_4_;
  auVar34._4_4_ = auVar47._4_4_ + auVar35._4_4_;
  auVar34._8_4_ = auVar47._8_4_ + auVar35._8_4_;
  auVar34._12_4_ = auVar47._12_4_ + auVar35._12_4_;
  auVar34._16_4_ = auVar47._16_4_ + auVar35._16_4_;
  auVar34._20_4_ = auVar47._20_4_ + auVar35._20_4_;
  auVar34._24_4_ = auVar47._24_4_ + auVar35._24_4_;
  auVar34._28_4_ = auVar47._28_4_ + auVar35._28_4_;
  auVar11._4_4_ = fStack_23dc;
  auVar11._0_4_ = local_23e0;
  auVar11._8_4_ = fStack_23d8;
  auVar11._12_4_ = fStack_23d4;
  auVar11._16_4_ = fStack_23d0;
  auVar11._20_4_ = fStack_23cc;
  auVar11._24_4_ = fStack_23c8;
  auVar11._28_4_ = fStack_23c4;
  auVar11 = vsubps_avx(auVar45,auVar11);
  auVar36._0_4_ = fVar3 + local_23e0;
  auVar36._4_4_ = fVar3 + fStack_23dc;
  auVar36._8_4_ = fVar3 + fStack_23d8;
  auVar36._12_4_ = fVar3 + fStack_23d4;
  auVar36._16_4_ = fVar3 + fStack_23d0;
  auVar36._20_4_ = fVar3 + fStack_23cc;
  auVar36._24_4_ = fVar3 + fStack_23c8;
  auVar36._28_4_ = fVar3 + fStack_23c4;
  auVar12._4_4_ = fStack_23fc;
  auVar12._0_4_ = local_2400;
  auVar12._8_4_ = fStack_23f8;
  auVar12._12_4_ = fStack_23f4;
  auVar12._16_4_ = fStack_23f0;
  auVar12._20_4_ = fStack_23ec;
  auVar12._24_4_ = fStack_23e8;
  auVar12._28_4_ = fStack_23e4;
  auVar12 = vsubps_avx(auVar44,auVar12);
  auVar37._0_4_ = fVar4 + local_2400;
  auVar37._4_4_ = fVar4 + fStack_23fc;
  auVar37._8_4_ = fVar4 + fStack_23f8;
  auVar37._12_4_ = fVar4 + fStack_23f4;
  auVar37._16_4_ = fVar4 + fStack_23f0;
  auVar37._20_4_ = fVar4 + fStack_23ec;
  auVar37._24_4_ = fVar4 + fStack_23e8;
  auVar37._28_4_ = fVar4 + fStack_23e4;
  while( true ) {
    pauVar16 = pauVar23 + -1;
    pauVar23 = pauVar23 + -1;
    if ((float)local_24b0._0_4_ < *(float *)(*pauVar16 + 8)) break;
    pauVar16 = pauVar23;
    uVar27 = *(ulong *)*pauVar23;
LAB_014cd4bf:
    pauVar23 = pauVar16;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar27 & 8) != 0) {
LAB_014cd964:
        uVar28 = (ulong)((uint)uVar27 & 0xf);
        if (uVar28 == 8) break;
        lVar24 = (uVar27 & 0xfffffffffffffff0) + 0xa0;
        lVar19 = 0;
        bVar20 = 0;
        goto LAB_014cd98d;
      }
      auVar8 = vmaxps_avx(auVar46,*(undefined1 (*) [32])(uVar27 + 0x40));
      auVar41 = vminps_avx(auVar8,*(undefined1 (*) [32])(uVar27 + 0x60));
      auVar8 = vmaxps_avx(auVar45,*(undefined1 (*) [32])(uVar27 + 0x80));
      auVar41 = vsubps_avx(auVar41,auVar46);
      auVar8 = vminps_avx(auVar8,*(undefined1 (*) [32])(uVar27 + 0xa0));
      auVar13 = vsubps_avx(auVar8,auVar45);
      auVar8 = vmaxps_avx(auVar44,*(undefined1 (*) [32])(uVar27 + 0xc0));
      auVar8 = vminps_avx(auVar8,*(undefined1 (*) [32])(uVar27 + 0xe0));
      auVar8 = vsubps_avx(auVar8,auVar44);
      local_2440._0_4_ =
           auVar41._0_4_ * auVar41._0_4_ + auVar13._0_4_ * auVar13._0_4_ +
           auVar8._0_4_ * auVar8._0_4_;
      local_2440._4_4_ =
           auVar41._4_4_ * auVar41._4_4_ + auVar13._4_4_ * auVar13._4_4_ +
           auVar8._4_4_ * auVar8._4_4_;
      fStack_2438 = auVar41._8_4_ * auVar41._8_4_ + auVar13._8_4_ * auVar13._8_4_ +
                    auVar8._8_4_ * auVar8._8_4_;
      fStack_2434 = auVar41._12_4_ * auVar41._12_4_ + auVar13._12_4_ * auVar13._12_4_ +
                    auVar8._12_4_ * auVar8._12_4_;
      fStack_2430 = auVar41._16_4_ * auVar41._16_4_ + auVar13._16_4_ * auVar13._16_4_ +
                    auVar8._16_4_ * auVar8._16_4_;
      fStack_242c = auVar41._20_4_ * auVar41._20_4_ + auVar13._20_4_ * auVar13._20_4_ +
                    auVar8._20_4_ * auVar8._20_4_;
      fStack_2428 = auVar41._24_4_ * auVar41._24_4_ + auVar13._24_4_ * auVar13._24_4_ +
                    auVar8._24_4_ * auVar8._24_4_;
      fStack_2424 = auVar41._28_4_ + auVar13._28_4_ + auVar13._28_4_;
      auVar8 = vcmpps_avx(_local_2440,auVar31,2);
      auVar41 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0x40),
                           *(undefined1 (*) [32])(uVar27 + 0x60),2);
      auVar8 = vandps_avx(auVar8,auVar41);
      auVar38 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
    }
    else {
      if ((uVar27 & 8) != 0) goto LAB_014cd964;
      auVar8 = *(undefined1 (*) [32])(uVar27 + 0x40);
      auVar41 = *(undefined1 (*) [32])(uVar27 + 0x60);
      auVar13 = vmaxps_avx(auVar46,auVar8);
      auVar13 = vminps_avx(auVar13,auVar41);
      auVar14 = vsubps_avx(auVar13,auVar46);
      auVar13 = vmaxps_avx(auVar45,*(undefined1 (*) [32])(uVar27 + 0x80));
      auVar13 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar27 + 0xa0));
      auVar15 = vsubps_avx(auVar13,auVar45);
      auVar13 = vmaxps_avx(auVar44,*(undefined1 (*) [32])(uVar27 + 0xc0));
      auVar13 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar27 + 0xe0));
      auVar13 = vsubps_avx(auVar13,auVar44);
      local_2440._4_4_ =
           auVar14._4_4_ * auVar14._4_4_ + auVar15._4_4_ * auVar15._4_4_ +
           auVar13._4_4_ * auVar13._4_4_;
      local_2440._0_4_ =
           auVar14._0_4_ * auVar14._0_4_ + auVar15._0_4_ * auVar15._0_4_ +
           auVar13._0_4_ * auVar13._0_4_;
      fStack_2438 = auVar14._8_4_ * auVar14._8_4_ + auVar15._8_4_ * auVar15._8_4_ +
                    auVar13._8_4_ * auVar13._8_4_;
      fStack_2434 = auVar14._12_4_ * auVar14._12_4_ + auVar15._12_4_ * auVar15._12_4_ +
                    auVar13._12_4_ * auVar13._12_4_;
      fStack_2430 = auVar14._16_4_ * auVar14._16_4_ + auVar15._16_4_ * auVar15._16_4_ +
                    auVar13._16_4_ * auVar13._16_4_;
      fStack_242c = auVar14._20_4_ * auVar14._20_4_ + auVar15._20_4_ * auVar15._20_4_ +
                    auVar13._20_4_ * auVar13._20_4_;
      fStack_2428 = auVar14._24_4_ * auVar14._24_4_ + auVar15._24_4_ * auVar15._24_4_ +
                    auVar13._24_4_ * auVar13._24_4_;
      fStack_2424 = auVar14._28_4_ + auVar15._28_4_ + auVar13._28_4_;
      auVar13 = vcmpps_avx(auVar8,auVar41,2);
      auVar14 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0xa0),auVar11,5);
      auVar13 = vandps_avx(auVar13,auVar14);
      auVar8 = vcmpps_avx(auVar8,auVar34,2);
      auVar14 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0x80),auVar36,2);
      auVar8 = vandps_avx(auVar14,auVar8);
      auVar14 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0xe0),auVar12,5);
      auVar13 = vandps_avx(auVar13,auVar14);
      auVar41 = vcmpps_avx(auVar41,auVar10,5);
      auVar14 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0xc0),auVar37,2);
      auVar41 = vandps_avx(auVar41,auVar14);
      auVar8 = vandps_avx(auVar8,auVar41);
      auVar8 = vandps_avx(auVar13,auVar8);
      auVar41._8_4_ = 0xffff;
      auVar41._0_8_ = 0xffff0000ffff;
      auVar41._12_4_ = 0xffff;
      auVar41._16_4_ = 0xffff;
      auVar41._20_4_ = 0xffff;
      auVar41._24_4_ = 0xffff;
      auVar41._28_4_ = 0xffff;
      auVar8 = vandps_avx(auVar41,auVar8);
      auVar38 = vpackusdw_avx(auVar8._0_16_,auVar8._16_16_);
    }
    auVar38 = vpsllw_avx(auVar38,0xf);
    if ((((((((auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0')
    {
      auVar38 = vpacksswb_avx(auVar38,auVar38);
      bVar20 = SUB161(auVar38 >> 7,0) & 1 | (SUB161(auVar38 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar38 >> 0x17,0) & 1) << 2 | (SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar38 >> 0x27,0) & 1) << 4 | (SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar38 >> 0x37,0) & 1) << 6 | SUB161(auVar38 >> 0x3f,0) << 7;
      uVar28 = uVar27 & 0xfffffffffffffff0;
      lVar19 = 0;
      if (bVar20 != 0) {
        for (; (bVar20 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar27 = *(ulong *)(uVar28 + lVar19 * 8);
      uVar26 = bVar20 - 1 & (uint)bVar20;
      pauVar16 = pauVar23;
      if (uVar26 != 0) {
        uVar6 = *(uint *)(local_2440 + lVar19 * 4);
        lVar19 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar21 = *(ulong *)(uVar28 + lVar19 * 8);
        uVar7 = *(uint *)(local_2440 + lVar19 * 4);
        uVar26 = uVar26 - 1 & uVar26;
        if (uVar26 == 0) {
          pauVar16 = pauVar23 + 1;
          if (uVar6 < uVar7) {
            *(ulong *)*pauVar23 = uVar21;
            *(uint *)(*pauVar23 + 8) = uVar7;
          }
          else {
            *(ulong *)*pauVar23 = uVar27;
            *(uint *)(*pauVar23 + 8) = uVar6;
            uVar27 = uVar21;
          }
        }
        else {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar27;
          auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar6));
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar21;
          auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar7));
          lVar19 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(uVar28 + lVar19 * 8);
          auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2440 + lVar19 * 4)));
          uVar26 = uVar26 - 1 & uVar26;
          if (uVar26 == 0) {
            auVar43 = vpcmpgtd_avx(auVar40,auVar38);
            auVar39 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar40,auVar38,auVar39);
            auVar38 = vblendvps_avx(auVar38,auVar40,auVar39);
            auVar40 = vpcmpgtd_avx(auVar42,auVar43);
            auVar39 = vpshufd_avx(auVar40,0xaa);
            auVar40 = vblendvps_avx(auVar42,auVar43,auVar39);
            auVar42 = vblendvps_avx(auVar43,auVar42,auVar39);
            auVar43 = vpcmpgtd_avx(auVar42,auVar38);
            auVar39 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar42,auVar38,auVar39);
            auVar38 = vblendvps_avx(auVar38,auVar42,auVar39);
            *pauVar23 = auVar38;
            pauVar23[1] = auVar43;
            uVar27 = auVar40._0_8_;
            pauVar16 = pauVar23 + 2;
          }
          else {
            lVar19 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *(ulong *)(uVar28 + lVar19 * 8);
            auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2440 + lVar19 * 4)));
            uVar26 = uVar26 - 1 & uVar26;
            uVar21 = (ulong)uVar26;
            if (uVar26 == 0) {
              auVar39 = vpcmpgtd_avx(auVar40,auVar38);
              auVar9 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar40,auVar38,auVar9);
              auVar38 = vblendvps_avx(auVar38,auVar40,auVar9);
              auVar40 = vpcmpgtd_avx(auVar43,auVar42);
              auVar9 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar43,auVar42,auVar9);
              auVar42 = vblendvps_avx(auVar42,auVar43,auVar9);
              auVar43 = vpcmpgtd_avx(auVar42,auVar38);
              auVar9 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar42,auVar38,auVar9);
              auVar38 = vblendvps_avx(auVar38,auVar42,auVar9);
              auVar42 = vpcmpgtd_avx(auVar40,auVar39);
              auVar9 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar40,auVar39,auVar9);
              auVar40 = vblendvps_avx(auVar39,auVar40,auVar9);
              auVar39 = vpcmpgtd_avx(auVar43,auVar40);
              auVar9 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar43,auVar40,auVar9);
              auVar40 = vblendvps_avx(auVar40,auVar43,auVar9);
              *pauVar23 = auVar38;
              pauVar23[1] = auVar40;
              pauVar23[2] = auVar39;
              uVar27 = auVar42._0_8_;
              pauVar16 = pauVar23 + 3;
            }
            else {
              *pauVar23 = auVar38;
              pauVar23[1] = auVar40;
              pauVar23[2] = auVar42;
              pauVar23[3] = auVar43;
              lVar19 = 0x30;
              do {
                lVar24 = lVar19;
                lVar19 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                uVar27 = *(ulong *)(uVar28 + lVar19 * 8);
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar27;
                auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_2440 + lVar19 * 4)));
                *(undefined1 (*) [16])(pauVar23[1] + lVar24) = auVar38;
                uVar21 = uVar21 & uVar21 - 1;
                lVar19 = lVar24 + 0x10;
              } while (uVar21 != 0);
              pauVar16 = (undefined1 (*) [16])(pauVar23[1] + lVar24);
              if (lVar24 + 0x10 != 0) {
                lVar19 = 0x10;
                pauVar22 = pauVar23;
                do {
                  auVar38 = pauVar22[1];
                  pauVar22 = pauVar22 + 1;
                  uVar26 = vextractps_avx(auVar38,2);
                  lVar24 = lVar19;
                  do {
                    if (uVar26 <= *(uint *)(pauVar23[-1] + lVar24 + 8)) {
                      pauVar25 = (undefined1 (*) [16])(*pauVar23 + lVar24);
                      break;
                    }
                    *(undefined1 (*) [16])(*pauVar23 + lVar24) =
                         *(undefined1 (*) [16])(pauVar23[-1] + lVar24);
                    lVar24 = lVar24 + -0x10;
                    pauVar25 = pauVar23;
                  } while (lVar24 != 0);
                  *pauVar25 = auVar38;
                  lVar19 = lVar19 + 0x10;
                } while (pauVar16 != pauVar22);
                uVar27 = *(ulong *)*pauVar16;
              }
            }
          }
        }
      }
      goto LAB_014cd4bf;
    }
    if (pauVar23 == (undefined1 (*) [16])&local_23a0) {
      return bVar18;
    }
  }
  auVar35 = ZEXT3264(local_2420);
  goto LAB_014cda9d;
LAB_014cd98d:
  do {
    lVar29 = -4;
    bVar30 = 0;
    do {
      uVar26 = *(uint *)(lVar24 + lVar29 * 4);
      if ((ulong)uVar26 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar26].ptr;
      context->geomID = uVar26;
      context->primID = *(uint *)(lVar24 + 0x10 + lVar29 * 4);
      auVar32 = ZEXT1664(auVar32._0_16_);
      bVar17 = Geometry::pointQuery(this,query,context);
      auVar47 = ZEXT3264(local_23c0);
      bVar30 = bVar30 | bVar17;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 0);
    bVar20 = bVar20 | bVar30;
    lVar19 = lVar19 + 1;
    lVar24 = lVar24 + 0xb0;
  } while (lVar19 != uVar28 - 8);
  if (bVar20 == 0) {
    auVar35 = ZEXT3264(local_2420);
  }
  else {
    uVar2 = *(undefined4 *)&(context->query_radius).field_0;
    auVar35 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
    local_23e0 = (context->query_radius).field_0.m128[1];
    fStack_23dc = local_23e0;
    fStack_23d8 = local_23e0;
    fStack_23d4 = local_23e0;
    fStack_23d0 = local_23e0;
    fStack_23cc = local_23e0;
    fStack_23c8 = local_23e0;
    fStack_23c4 = local_23e0;
    local_2400 = (context->query_radius).field_0.m128[2];
    fStack_23fc = local_2400;
    fStack_23f8 = local_2400;
    fStack_23f4 = local_2400;
    fStack_23f0 = local_2400;
    fStack_23ec = local_2400;
    fStack_23e8 = local_2400;
    fStack_23e4 = local_2400;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar32 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      auVar38 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar32 = ZEXT1664(auVar38);
    }
    local_24b0 = auVar32._0_16_;
    bVar18 = true;
  }
LAB_014cda9d:
  auVar33._0_4_ = auVar35._0_4_ * auVar35._0_4_;
  auVar33._4_4_ = auVar35._4_4_ * auVar35._4_4_;
  auVar33._8_4_ = auVar35._8_4_ * auVar35._8_4_;
  auVar33._12_4_ = auVar35._12_4_ * auVar35._12_4_;
  auVar33._16_4_ = auVar35._16_4_ * auVar35._16_4_;
  auVar33._20_4_ = auVar35._20_4_ * auVar35._20_4_;
  auVar33._28_36_ = auVar32._28_36_;
  auVar33._24_4_ = auVar35._24_4_ * auVar35._24_4_;
  auVar31 = auVar33._0_32_;
  if (pauVar23 == (undefined1 (*) [16])&local_23a0) {
    return bVar18;
  }
  goto LAB_014cd474;
}

Assistant:

bool BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::pointQuery(
      const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
    {
      return PointQueryDispatch<N, types, robust, PrimitiveIntersector1>::pointQuery(This, query, context);
    }